

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  uint uVar22;
  undefined1 (*pauVar23) [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  auVar8 = _DAT_005f07a0;
  auVar7 = _DAT_005f0780;
  auVar26 = in_ZMM3._0_16_;
  iVar1 = bottom_top_blob->elempack;
  iVar10 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  iVar3 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar10 == 2) {
    if (0 < (int)uVar9) {
      uVar15 = iVar1 * iVar2;
      uVar21 = 0;
      auVar24._8_8_ = 0x8000000000000000;
      auVar24._0_8_ = 0x8000000000000000;
      auVar26 = vpcmpeqd_avx(auVar26,auVar26);
      do {
        pvVar5 = (this->super_BatchNorm).a_data.data;
        uVar22 = *(uint *)((long)pvVar5 + uVar21 * 4);
        if (iVar1 == 4) {
          auVar31 = *(undefined1 (*) [16])((long)pvVar5 + uVar21 * 0x10);
        }
        else {
          auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        }
        pvVar6 = (this->super_BatchNorm).b_data.data;
        uVar14 = *(uint *)((long)pvVar6 + uVar21 * 4);
        if (iVar1 == 4) {
          auVar25 = *(undefined1 (*) [16])((long)pvVar6 + uVar21 * 0x10);
        }
        else {
          auVar25 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        }
        if (iVar1 == 8) {
          auVar33 = *(undefined1 (*) [32])((long)pvVar5 + uVar21 * 0x20);
          auVar39 = *(undefined1 (*) [32])((long)pvVar6 + uVar21 * 0x20);
        }
        else {
          auVar33._16_16_ = auVar31;
          auVar33._0_16_ = auVar31;
          auVar39._16_16_ = auVar25;
          auVar39._0_16_ = auVar25;
        }
        pauVar23 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar11 = 0;
        if (7 < (int)uVar15) {
          iVar13 = 7;
          do {
            auVar32 = vfmadd132ps_fma(*pauVar23,auVar33,auVar39);
            *pauVar23 = ZEXT1632(auVar32);
            pauVar23 = pauVar23 + 1;
            iVar13 = iVar13 + 8;
            uVar11 = uVar15 & 0xfffffff8;
          } while (iVar13 < (int)uVar15);
        }
        uVar16 = uVar11 | 3;
        while ((int)uVar16 < (int)uVar15) {
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar23,auVar31,auVar25);
          *(undefined1 (*) [16])*pauVar23 = auVar32;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar16 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar15) {
          uVar18 = CONCAT44(0,~uVar11 + uVar15);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar18;
          auVar32 = vpshufd_avx(auVar31,0x44);
          auVar31 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
          auVar29._16_16_ = auVar31;
          auVar29._0_16_ = auVar31;
          auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
          auVar27._16_16_ = auVar31;
          auVar27._0_16_ = auVar31;
          auVar31 = vorps_avx(auVar32,auVar24);
          auVar25 = vorps_avx(auVar32,auVar24);
          uVar19 = 0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar19;
            auVar35 = vpshufd_avx(auVar35,0x44);
            auVar40._16_16_ = auVar35;
            auVar40._0_16_ = auVar35;
            auVar33 = vorps_avx(auVar40,auVar7);
            auVar39 = vorps_avx(auVar40,auVar8);
            auVar35 = vorps_avx(auVar32,auVar24);
            auVar47._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar39._24_4_;
            auVar47._12_4_ = auVar39._28_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar47,auVar35);
            auVar36._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
            auVar36._8_4_ = auVar39._8_4_;
            auVar36._12_4_ = auVar39._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar36,auVar31);
            auVar47 = vpackssdw_avx(auVar36,auVar47);
            auVar48._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
            auVar48._8_4_ = auVar33._24_4_;
            auVar48._12_4_ = auVar33._28_4_ ^ 0x80000000;
            auVar35 = vpcmpgtq_avx(auVar48,auVar35);
            auVar45._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
            auVar45._8_4_ = auVar33._8_4_;
            auVar45._12_4_ = auVar33._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar45,auVar25);
            auVar35 = vpackssdw_avx(auVar36,auVar35);
            auVar35 = vpackssdw_avx(auVar35 ^ auVar26,auVar47 ^ auVar26);
            auVar47 = vpmovsxwd_avx(auVar35);
            auVar35 = vpunpckhwd_avx(auVar35,auVar35);
            auVar41._16_16_ = auVar35;
            auVar41._0_16_ = auVar47;
            auVar33 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(*pauVar23 + uVar19 * 4));
            auVar35 = vfmadd213ps_fma(auVar33,auVar29,auVar27);
            auVar33 = vmaskmovps_avx(auVar41,ZEXT1632(auVar35));
            *(undefined1 (*) [32])(*pauVar23 + uVar19 * 4) = auVar33;
            uVar19 = uVar19 + 8;
          } while ((uVar18 + 8 & 0x1fffffff8) != uVar19);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar9);
    }
  }
  else if (iVar10 == 1) {
    pauVar23 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar12 = (undefined1 (*) [32])(this->super_BatchNorm).a_data.data;
    pauVar20 = (undefined1 (*) [32])(this->super_BatchNorm).b_data.data;
    uVar22 = iVar1 * iVar2;
    uVar15 = 0;
    if (7 < (int)uVar22) {
      uVar15 = uVar22 & 0x7ffffff8;
      iVar13 = 7;
      do {
        auVar24 = vfmadd213ps_fma(*pauVar20,*pauVar23,*pauVar12);
        *pauVar23 = ZEXT1632(auVar24);
        pauVar23 = pauVar23 + 1;
        pauVar12 = pauVar12 + 1;
        pauVar20 = pauVar20 + 1;
        iVar13 = iVar13 + 8;
      } while (iVar13 < (int)uVar22);
    }
    uVar14 = uVar15 | 3;
    while ((int)uVar14 < (int)uVar22) {
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar20,*(undefined1 (*) [16])*pauVar23,
                                *(undefined1 (*) [16])*pauVar12);
      *(undefined1 (*) [16])*pauVar23 = auVar24;
      pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
      pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
      uVar14 = uVar15 + 7;
      uVar15 = uVar15 + 4;
    }
    if (uVar22 - uVar15 != 0 && (int)uVar15 <= (int)uVar22) {
      lVar17 = 0;
      do {
        auVar24 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar23 + lVar17 * 4)),
                                  ZEXT416(*(uint *)(*pauVar20 + lVar17 * 4)),
                                  ZEXT416(*(uint *)(*pauVar12 + lVar17 * 4)));
        *(int *)(*pauVar23 + lVar17 * 4) = auVar24._0_4_;
        lVar17 = lVar17 + 1;
      } while (uVar22 - uVar15 != (int)lVar17);
    }
  }
  auVar8 = _DAT_005f07a0;
  auVar7 = _DAT_005f0780;
  if ((iVar10 - 3U < 2) && (0 < (int)uVar4)) {
    uVar9 = iVar2 * iVar1 * uVar9 * iVar3;
    uVar21 = 0;
    auVar25._8_8_ = 0x8000000000000000;
    auVar25._0_8_ = 0x8000000000000000;
    auVar26 = vpcmpeqd_avx(auVar26,auVar26);
    do {
      pvVar5 = (this->super_BatchNorm).a_data.data;
      uVar15 = *(uint *)((long)pvVar5 + uVar21 * 4);
      if (iVar1 == 4) {
        auVar24 = *(undefined1 (*) [16])((long)pvVar5 + uVar21 * 0x10);
      }
      else {
        auVar24 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
      }
      pvVar6 = (this->super_BatchNorm).b_data.data;
      uVar22 = *(uint *)((long)pvVar6 + uVar21 * 4);
      if (iVar1 == 4) {
        auVar31 = *(undefined1 (*) [16])((long)pvVar6 + uVar21 * 0x10);
      }
      else {
        auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
      }
      if (iVar1 == 8) {
        auVar34 = *(undefined1 (*) [32])((long)pvVar5 + uVar21 * 0x20);
        auVar42 = *(undefined1 (*) [32])((long)pvVar6 + uVar21 * 0x20);
      }
      else {
        auVar34._16_16_ = auVar24;
        auVar34._0_16_ = auVar24;
        auVar42._16_16_ = auVar31;
        auVar42._0_16_ = auVar31;
      }
      pauVar23 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar21 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar14 = 0;
      if (7 < (int)uVar9) {
        iVar10 = 7;
        do {
          auVar32 = vfmadd132ps_fma(*pauVar23,auVar34,auVar42);
          *pauVar23 = ZEXT1632(auVar32);
          pauVar23 = pauVar23 + 1;
          iVar10 = iVar10 + 8;
          uVar14 = uVar9 & 0xfffffff8;
        } while (iVar10 < (int)uVar9);
      }
      uVar11 = uVar14 | 3;
      while ((int)uVar11 < (int)uVar9) {
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar23,auVar24,auVar31);
        *(undefined1 (*) [16])*pauVar23 = auVar32;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
        uVar11 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
      if ((int)uVar14 < (int)uVar9) {
        uVar18 = CONCAT44(0,~uVar14 + uVar9);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar18;
        auVar32 = vpshufd_avx(auVar32,0x44);
        auVar24 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        auVar30._16_16_ = auVar24;
        auVar30._0_16_ = auVar24;
        auVar24 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
        auVar28._16_16_ = auVar24;
        auVar28._0_16_ = auVar24;
        auVar24 = vorps_avx(auVar32,auVar25);
        auVar31 = vorps_avx(auVar32,auVar25);
        uVar19 = 0;
        do {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar19;
          auVar35 = vpshufd_avx(auVar37,0x44);
          auVar43._16_16_ = auVar35;
          auVar43._0_16_ = auVar35;
          auVar33 = vorps_avx(auVar43,auVar7);
          auVar39 = vorps_avx(auVar43,auVar8);
          auVar35 = vorps_avx(auVar32,auVar25);
          auVar49._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
          auVar49._8_4_ = auVar39._24_4_;
          auVar49._12_4_ = auVar39._28_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar49,auVar35);
          auVar38._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
          auVar38._8_4_ = auVar39._8_4_;
          auVar38._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar38,auVar24);
          auVar47 = vpackssdw_avx(auVar36,auVar47);
          auVar50._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
          auVar50._8_4_ = auVar33._24_4_;
          auVar50._12_4_ = auVar33._28_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar50,auVar35);
          auVar46._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar33._8_4_;
          auVar46._12_4_ = auVar33._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar46,auVar31);
          auVar35 = vpackssdw_avx(auVar36,auVar35);
          auVar35 = vpackssdw_avx(auVar35 ^ auVar26,auVar47 ^ auVar26);
          auVar47 = vpmovsxwd_avx(auVar35);
          auVar35 = vpunpckhwd_avx(auVar35,auVar35);
          auVar44._16_16_ = auVar35;
          auVar44._0_16_ = auVar47;
          auVar33 = vmaskmovps_avx(auVar44,*(undefined1 (*) [32])(*pauVar23 + uVar19 * 4));
          auVar35 = vfmadd213ps_fma(auVar33,auVar30,auVar28);
          auVar33 = vmaskmovps_avx(auVar44,ZEXT1632(auVar35));
          *(undefined1 (*) [32])(*pauVar23 + uVar19 * 4) = auVar33;
          uVar19 = uVar19 + 8;
        } while ((uVar18 + 8 & 0x1fffffff8) != uVar19);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar4);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}